

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O2

size_t fiobj_str_write_i(FIOBJ dest,int64_t num)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  char *pcVar3;
  ulong uVar4;
  fio_str_s_conflict *s;
  long lVar5;
  undefined8 uStack_50;
  char local_48 [24];
  fio_str_info_s i;
  
  if (((uint)dest & 7) == 2) {
    uVar4 = dest & 0xfffffffffffffff8;
    if (*(char *)(uVar4 + 0x11) == '\0') {
      *(undefined8 *)(uVar4 + 8) = 0;
      s = (fio_str_s_conflict *)(uVar4 + 0x10);
      if (num == 0) {
        uStack_50 = (code *)0x11b872;
        sVar2 = fio_str_len(s);
        uStack_50 = (code *)0x11b886;
        fio_str_resize(&i,s,sVar2 + 1);
        i.data[i.len - 1] = '0';
      }
      else {
        uVar4 = -num;
        if (0 < num) {
          uVar4 = num;
        }
        lVar5 = 0;
        while (uVar4 != 0) {
          auVar1._8_8_ = 0;
          auVar1._0_8_ = uVar4;
          local_48[lVar5] = (char)uVar4 + SUB161(auVar1 / ZEXT816(10),0) * -10 + '0';
          lVar5 = lVar5 + 1;
          uVar4 = SUB168(auVar1 / ZEXT816(10),0);
        }
        if (num < 0) {
          local_48[lVar5] = '-';
          lVar5 = lVar5 + 1;
        }
        uStack_50 = (code *)0x11b82b;
        sVar2 = fio_str_len(s);
        uStack_50 = (code *)0x11b83f;
        fio_str_resize(&i,s,sVar2 + lVar5);
        pcVar3 = i.data + (i.len - lVar5);
        while (lVar5 != 0) {
          *pcVar3 = local_48[lVar5 + -1];
          pcVar3 = pcVar3 + 1;
          lVar5 = lVar5 + -1;
        }
      }
    }
    else {
      i.len = 0;
    }
    return i.len;
  }
  uStack_50 = fiobj_str_printf;
  __assert_fail("FIOBJ_TYPE_IS(dest, FIOBJ_T_STRING)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/facil/lib/facil/fiobj/fiobj_str.c"
                ,0x103,"size_t fiobj_str_write_i(FIOBJ, int64_t)");
}

Assistant:

size_t fiobj_str_write_i(FIOBJ dest, int64_t num) {
  assert(FIOBJ_TYPE_IS(dest, FIOBJ_T_STRING));
  if (obj2str(dest)->str.frozen)
    return 0;
  obj2str(dest)->hash = 0;
  return fio_str_write_i(&obj2str(dest)->str, num).len;
}